

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> as_str;
  Roman_int rint;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_map;
  stringstream ss;
  long *local_248;
  long local_240;
  long local_238 [2];
  Roman_int local_228;
  long *local_208;
  long local_1f8 [2];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  pcVar1 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"problem_6_test.txt","");
  generate_test_file((string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"problem_6_test.txt","");
  read_test_file((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1e8,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1e8._M_impl.super__Rb_tree_header) {
    p_Var5 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Roman_int::Roman_int(&local_228,(string *)&p_Var5[1]._M_parent);
      _Var3 = Roman_int::as_int(&local_228);
      _Var2 = p_Var5[1]._M_color;
      local_248 = local_238;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,p_Var5[1]._M_parent,
                 (long)&(p_Var5[1]._M_parent)->_M_color + (long)&(p_Var5[1]._M_left)->_M_color);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(char *)local_248,local_240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," == ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__cxx11::stringbuf::str();
      if (_Var2 != _Var3) {
        __assert_fail("(ss.str(), compare_with == as_int)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_2_input_and_output/ch_10/problem_6.cpp"
                      ,0x18,"int main()");
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.m_numerals._M_dataplus._M_p != &local_228.m_numerals.field_2) {
        operator_delete(local_228.m_numerals._M_dataplus._M_p,
                        local_228.m_numerals.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_1e8._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test passed\n",0xc);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1e8);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto file_name{ "problem_6_test.txt" };
		generate_test_file(file_name);
		auto test_map = read_test_file(file_name);
		for (auto it = test_map.begin(); it != test_map.end(); ++it)
		{
			Roman_int rint{ it->second };
			auto as_int = rint.as_int();
			auto compare_with = it->first;
			auto as_str = it->second;
			std::stringstream ss;
			ss << as_str << " == " << as_int;
			assert((ss.str(), compare_with == as_int));
		}
		
		std::cout << "Test passed\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}